

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgemm.hpp
# Opt level: O0

void remora::bindings::
     pack_A_dense<remora::dense_matrix_adaptor<double_const,remora::column_major,remora::dense_tag,remora::cpu_tag>,double,remora::bindings::gemm_block_size<double>>
               (matrix_expression<remora::dense_matrix_adaptor<const_double,_remora::column_major,_remora::dense_tag,_remora::cpu_tag>,_remora::cpu_tag>
                *param_1,long param_2)

{
  dense_matrix_adaptor<const_double,_remora::column_major,_remora::dense_tag,_remora::cpu_tag>
  *pdVar1;
  size_type sVar2;
  size_type sVar3;
  matrix_element<const_double,_remora::column_major> *this;
  ulong uVar4;
  double *pdVar5;
  size_t i;
  size_t j;
  size_t l;
  size_t nu;
  size_t mp;
  size_t kc;
  size_t mc;
  matrix_element<const_double,_remora::column_major> A_elem;
  double local_68;
  dense_matrix_adaptor<const_double,_remora::column_major,_remora::dense_tag,_remora::cpu_tag>
  *in_stack_ffffffffffffffa0;
  ulong local_58;
  matrix_element<const_double,_remora::column_major> *j_00;
  size_t i_00;
  
  matrix_expression<remora::dense_matrix_adaptor<const_double,_remora::column_major,_remora::dense_tag,_remora::cpu_tag>,_remora::cpu_tag>
  ::operator()(param_1);
  dense_matrix_adaptor<const_double,_remora::column_major,_remora::dense_tag,_remora::cpu_tag>::
  elements(in_stack_ffffffffffffffa0);
  pdVar1 = matrix_expression<remora::dense_matrix_adaptor<const_double,_remora::column_major,_remora::dense_tag,_remora::cpu_tag>,_remora::cpu_tag>
           ::operator()(param_1);
  sVar2 = dense_matrix_adaptor<const_double,_remora::column_major,_remora::dense_tag,_remora::cpu_tag>
          ::size1(pdVar1);
  pdVar1 = matrix_expression<remora::dense_matrix_adaptor<const_double,_remora::column_major,_remora::dense_tag,_remora::cpu_tag>,_remora::cpu_tag>
           ::operator()(param_1);
  sVar3 = dense_matrix_adaptor<const_double,_remora::column_major,_remora::dense_tag,_remora::cpu_tag>
          ::size2(pdVar1);
  this = (matrix_element<const_double,_remora::column_major> *)(sVar2 + 3 >> 2);
  i_00 = 0;
  for (j_00 = (matrix_element<const_double,_remora::column_major> *)0x0; j_00 < this;
      j_00 = (matrix_element<const_double,_remora::column_major> *)
             ((long)&(j_00->m_storage).values + 1)) {
    for (local_58 = 0; local_58 < sVar3; local_58 = local_58 + 1) {
      for (uVar4 = (long)j_00 << 2; uVar4 < (long)j_00 * 4 + 4U; uVar4 = uVar4 + 1) {
        if (uVar4 < sVar2) {
          pdVar5 = device_traits<remora::cpu_tag>::
                   matrix_element<const_double,_remora::column_major>::operator()
                             (this,i_00,(size_t)j_00);
          local_68 = *pdVar5;
        }
        else {
          local_68 = 0.0;
        }
        *(double *)(param_2 + i_00 * 8) = local_68;
        i_00 = i_00 + 1;
      }
    }
  }
  return;
}

Assistant:

void pack_A_dense(matrix_expression<E, cpu_tag> const& A, T* p, block_size){
	BOOST_ALIGN_ASSUME_ALIGNED(p, block_size::block::align);
	auto A_elem = A().elements();

	std::size_t const mc = A().size1();
	std::size_t const kc = A().size2();
	static std::size_t const MR = block_size::mr;
	const std::size_t mp = (mc+MR-1) / MR;

	std::size_t nu = 0;
	for (std::size_t l=0; l<mp; ++l) {
		for (std::size_t j=0; j<kc; ++j) {
			for (std::size_t i = l*MR; i < l*MR + MR; ++i,++nu) {
				p[nu] = (i<mc) ? A_elem(i,j) : T(0);
			}
		}
	}
}